

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O3

void __thiscall script_p2sh_tests::sign::test_method(sign *this)

{
  uint uVar1;
  _func_int **pp_Var2;
  uint uVar3;
  pointer pCVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  lazy_ostream *assertion_descr;
  pointer *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  iterator in_R8;
  int *args_1;
  iterator in_R9;
  iterator pvVar10;
  int i;
  CKey *this_01;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  CMutableTransaction txFrom;
  PrecomputedTransactionData txdata;
  SignatureCache signature_cache;
  CMutableTransaction txTo [8];
  string reason;
  CScript evalScripts [4];
  CScript standardScripts [4];
  CKey key [4];
  FillableSigningProvider keystore;
  undefined **ppuVar11;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  assertion_result local_ac8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  int local_a90;
  int local_a8c;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  CMutableTransaction local_a28;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  CTransaction local_990;
  CScriptCheck local_910;
  undefined1 local_8c0 [28];
  uint local_8a4;
  undefined1 local_8a0 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_888 [10];
  vector<CTxOut,_std::allocator<CTxOut>_> local_798;
  undefined1 local_778 [16];
  undefined1 *local_768;
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_760 [2];
  direct_or_indirect local_730 [4];
  _Rb_tree_node_base local_6b0;
  size_t local_690;
  _Storage<TaprootBuilder,_false> local_688;
  undefined1 local_620;
  _Rb_tree_node_base local_610;
  size_t local_5f0;
  _Rb_tree_node_base local_5e0;
  size_t local_5c0;
  pointer puStack_5b8;
  pointer local_5b0;
  pointer puStack_5a8;
  _Rb_tree_node_base local_598;
  size_t local_578;
  _Rb_tree_node_base local_568;
  size_t local_548;
  _Rb_tree_node_base local_538;
  size_t local_518;
  pointer pCStack_510;
  pointer local_508;
  pointer pCStack_500;
  pointer local_4f8;
  pointer pCStack_4f0;
  pointer local_4e8;
  uchar auStack_4e0 [64];
  _Rb_tree_node_base local_4a0;
  size_t local_480;
  _Rb_tree_node_base local_470;
  size_t local_450;
  _Rb_tree_node_base local_440;
  size_t local_420;
  _Rb_tree_node_base local_410;
  size_t local_3f0;
  undefined1 local_3e8 [24];
  undefined8 uStack_3d0;
  pointer local_248 [4];
  string local_228;
  undefined1 local_208 [28];
  uint auStack_1ec [25];
  undefined1 local_188 [28];
  uint uStack_16c;
  char *local_168;
  size_type sStack_160;
  uchar auStack_15c [16];
  uint uStack_14c;
  undefined1 local_148 [32];
  _func_int **local_128;
  size_type sStack_120;
  uchar auStack_11c [16];
  uint uStack_10c;
  CKey local_108 [4];
  FillableSigningProvider local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  ppuVar11 = &PTR__FillableSigningProvider_013bee20;
  local_c8.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013bee20;
  lVar7 = 0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  local_c8.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  do {
    (&local_108[0].fCompressed)[lVar7] = false;
    *(undefined8 *)
     ((long)&local_108[0].keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + lVar7)
         = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  lVar7 = 0;
  local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    this_01 = (CKey *)(&local_108[0].fCompressed + lVar7);
    CKey::MakeNewKey(this_01,true);
    local_9a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_998 = "";
    local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x47;
    file.m_begin = (iterator)&local_9a0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_9b0,msg);
    CKey::GetPubKey((CPubKey *)local_778,this_01);
    iVar6 = (*local_c8.super_SigningProvider._vptr_SigningProvider[10])
                      (&local_c8,this_01,(lazy_ostream *)local_778);
    local_3e8[0] = (char)iVar6;
    local_3e8._8_4_ = 0;
    local_3e8[0xc] = '\0';
    local_3e8[0xd] = '\0';
    local_3e8[0xe] = '\0';
    local_3e8[0xf] = '\0';
    local_3e8[0x10] = '\0';
    local_3e8[0x11] = '\0';
    local_3e8[0x12] = '\0';
    local_3e8[0x13] = '\0';
    local_3e8[0x14] = '\0';
    local_3e8[0x15] = '\0';
    local_3e8[0x16] = '\0';
    local_3e8[0x17] = '\0';
    local_8a0._0_8_ = "keystore.AddKey(key[i])";
    local_8a0._8_4_ = 0xeb3c8b;
    local_8a0[0xc] = '\0';
    local_8a0[0xd] = '\0';
    local_8a0[0xe] = '\0';
    local_8a0[0xf] = '\0';
    local_778._8_8_ = local_778._8_8_ & 0xffffffffffffff00;
    local_778._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_768 = boost::unit_test::lazy_ostream::inst;
    local_9c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_9b8 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    avStack_760[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_8a0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_3e8,(lazy_ostream *)local_778,1,0,WARN,(check_type)ppuVar11
               ,(size_t)&local_9c0,0x47);
    boost::detail::shared_count::~shared_count((shared_count *)(local_3e8 + 0x10));
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  auStack_11c[4] = '\0';
  auStack_11c[5] = '\0';
  auStack_11c[6] = '\0';
  auStack_11c[7] = '\0';
  auStack_11c[8] = '\0';
  auStack_11c[9] = '\0';
  auStack_11c[10] = '\0';
  auStack_11c[0xb] = '\0';
  auStack_11c[0xc] = '\0';
  auStack_11c[0xd] = '\0';
  auStack_11c[0xe] = '\0';
  auStack_11c[0xf] = '\0';
  uStack_10c = 0;
  local_128 = (_func_int **)0x0;
  sStack_120 = 0;
  auStack_11c[0] = '\0';
  auStack_11c[1] = '\0';
  auStack_11c[2] = '\0';
  auStack_11c[3] = '\0';
  local_148._16_8_ = 0;
  local_148._24_8_ = 0;
  local_148._0_8_ = (char *)0x0;
  local_148._8_8_ = 0;
  auStack_15c[4] = '\0';
  auStack_15c[5] = '\0';
  auStack_15c[6] = '\0';
  auStack_15c[7] = '\0';
  auStack_15c[8] = '\0';
  auStack_15c[9] = '\0';
  auStack_15c[10] = '\0';
  auStack_15c[0xb] = '\0';
  auStack_15c[0xc] = '\0';
  auStack_15c[0xd] = '\0';
  auStack_15c[0xe] = '\0';
  auStack_15c[0xf] = '\0';
  uStack_14c = 0;
  local_168 = (char *)0x0;
  sStack_160 = 0;
  auStack_15c[0] = '\0';
  auStack_15c[1] = '\0';
  auStack_15c[2] = '\0';
  auStack_15c[3] = '\0';
  local_188._16_8_ = 0;
  stack0xfffffffffffffe90 = 0;
  local_188._0_8_ = (char *)0x0;
  local_188._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)local_778,local_108);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e8,(CPubKey *)local_778
            );
  other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188;
  ppVar8 = &CScript::operator<<((CScript *)other,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e8)
            ->super_CScriptBase;
  uVar1 = ppVar8->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_8a0[0] = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar3),local_8a0);
  if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3e8._0_8_,
                    CONCAT44(local_3e8._20_4_,local_3e8._16_4_) - local_3e8._0_8_);
  }
  CKey::GetPubKey((CPubKey *)local_3e8,local_108 + 1);
  PKHash::PKHash((PKHash *)local_208,(CPubKey *)local_3e8);
  local_768 = (undefined1 *)CONCAT44(local_768._4_4_,local_208._16_4_);
  local_778._0_8_ = local_208._0_8_;
  local_778._8_8_ = local_208._8_8_;
  local_730[0].direct[0] = '\x02';
  GetScriptForDestination((CScript *)local_8a0,(CTxDestination *)local_778);
  if (0x1c < uStack_14c) {
    free(local_168);
  }
  local_168 = (char *)local_8a0._0_8_;
  sStack_160 = local_8a0._8_4_;
  auStack_15c[0] = local_8a0[0xc];
  auStack_15c[1] = local_8a0[0xd];
  auStack_15c[2] = local_8a0[0xe];
  auStack_15c[3] = local_8a0[0xf];
  uStack_14c = local_888[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  local_888[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_778);
  CKey::GetPubKey((CPubKey *)local_778,local_108 + 1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e8,(CPubKey *)local_778
            );
  ppVar8 = &CScript::operator<<((CScript *)local_148,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3e8)
            ->super_CScriptBase;
  uVar1 = ppVar8->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_8a0[0] = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar3),local_8a0);
  if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3e8._0_8_,
                    CONCAT44(local_3e8._20_4_,local_3e8._16_4_) - local_3e8._0_8_);
  }
  CKey::GetPubKey((CPubKey *)local_3e8,local_108 + 2);
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208;
  PKHash::PKHash((PKHash *)ppVar8,(CPubKey *)local_3e8);
  local_768 = (undefined1 *)CONCAT44(local_768._4_4_,local_208._16_4_);
  local_778._0_8_ = local_208._0_8_;
  local_778._8_8_ = local_208._8_8_;
  local_730[0].direct[0] = '\x02';
  GetScriptForDestination((CScript *)local_8a0,(CTxDestination *)local_778);
  if (0x1c < uStack_10c) {
    free(local_128);
  }
  local_128 = (_func_int **)local_8a0._0_8_;
  sStack_120 = local_8a0._8_4_;
  auStack_11c[0] = local_8a0[0xc];
  auStack_11c[1] = local_8a0[0xd];
  auStack_11c[2] = local_8a0[0xe];
  auStack_11c[3] = local_8a0[0xf];
  uStack_10c = local_888[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
  local_888[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_778);
  auStack_1ec[0x15] = 0;
  auStack_1ec[0x16] = 0;
  auStack_1ec[0x17] = 0;
  auStack_1ec[0x18] = 0;
  auStack_1ec[0x11] = 0;
  auStack_1ec[0x12] = 0;
  auStack_1ec[0x13] = 0;
  auStack_1ec[0x14] = 0;
  auStack_1ec[0xd] = 0;
  auStack_1ec[0xe] = 0;
  auStack_1ec[0xf] = 0;
  auStack_1ec[0x10] = 0;
  auStack_1ec[9] = 0;
  auStack_1ec[10] = 0;
  auStack_1ec[0xb] = 0;
  auStack_1ec[0xc] = 0;
  auStack_1ec[5] = 0;
  auStack_1ec[6] = 0;
  auStack_1ec[7] = 0;
  auStack_1ec[8] = 0;
  auStack_1ec[1] = 0;
  auStack_1ec[2] = 0;
  auStack_1ec[3] = 0;
  auStack_1ec[4] = 0;
  local_208._16_8_ = 0;
  stack0xfffffffffffffe10 = 0;
  local_208._0_8_ = (char *)0x0;
  local_208[8] = '\0';
  local_208[9] = '\0';
  local_208[10] = '\0';
  local_208[0xb] = '\0';
  local_208[0xc] = '\0';
  local_208[0xd] = '\0';
  local_208[0xe] = '\0';
  local_208[0xf] = '\0';
  lVar7 = 0;
  do {
    local_9d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_9c8 = "";
    local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x54;
    file_00.m_begin = (iterator)&local_9d0;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_9e0,
               msg_00);
    bVar5 = FillableSigningProvider::AddCScript(&local_c8,(CScript *)(local_188 + lVar7));
    local_3e8[0] = bVar5;
    local_3e8._8_4_ = 0;
    local_3e8[0xc] = '\0';
    local_3e8[0xd] = '\0';
    local_3e8[0xe] = '\0';
    local_3e8[0xf] = '\0';
    local_3e8[0x10] = '\0';
    local_3e8[0x11] = '\0';
    local_3e8[0x12] = '\0';
    local_3e8[0x13] = '\0';
    local_3e8[0x14] = '\0';
    local_3e8[0x15] = '\0';
    local_3e8[0x16] = '\0';
    local_3e8[0x17] = '\0';
    local_8a0._0_8_ = "keystore.AddCScript(standardScripts[i])";
    local_8a0._8_4_ = 0xecc23f;
    local_8a0[0xc] = '\0';
    local_8a0[0xd] = '\0';
    local_8a0[0xe] = '\0';
    local_8a0[0xf] = '\0';
    local_778._8_8_ = local_778._8_8_ & 0xffffffffffffff00;
    local_778._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_768 = boost::unit_test::lazy_ostream::inst;
    local_9f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_9e8 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    avStack_760[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_8a0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_3e8,(lazy_ostream *)local_778,1,0,WARN,(check_type)ppuVar11
               ,(size_t)&local_9f0,0x54);
    boost::detail::shared_count::~shared_count((shared_count *)(local_3e8 + 0x10));
    ScriptHash::ScriptHash((ScriptHash *)local_8a0,(CScript *)(local_188 + lVar7));
    local_768 = (undefined1 *)CONCAT44(local_768._4_4_,local_8a0._16_4_);
    local_778._8_8_ = CONCAT44(local_8a0._12_4_,local_8a0._8_4_);
    local_778._0_8_ = local_8a0._0_8_;
    local_730[0].direct[0] = '\x03';
    GetScriptForDestination((CScript *)local_3e8,(CTxDestination *)local_778);
    if (0x1c < *(uint *)((long)auStack_1ec + lVar7)) {
      free(*(void **)(local_208 + lVar7));
    }
    *(ulong *)(local_208 + lVar7 + 0xc) = CONCAT44(local_3e8._16_4_,local_3e8._12_4_);
    *(ulong *)(local_208 + lVar7 + 0x14) = CONCAT44((undefined4)uStack_3d0,local_3e8._20_4_);
    *(undefined8 *)(local_208 + lVar7) = local_3e8._0_8_;
    *(ulong *)(local_208 + lVar7 + 8) = CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
    *(size_type *)((long)auStack_1ec + lVar7) = uStack_3d0._4_4_;
    uStack_3d0._4_4_ = 0;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_778);
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x80);
  CMutableTransaction::CMutableTransaction(&local_a28);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  lVar7 = 8;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_a28.vout,8);
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&(local_a28.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue + lVar7),ppVar8);
    *(undefined8 *)
     ((long)local_a28.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7 + -8) = 100000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&local_a28.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start[4].nValue + lVar7),other);
    *(undefined8 *)
     ((long)&local_a28.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase._union +
     lVar7 + 0x18) = 100000000;
    other = other + 1;
    ppVar8 = ppVar8 + 1;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0xa8);
  local_a38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x62;
  file_01.m_begin = (iterator)&local_a38;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_a48,
             msg_01);
  CTransaction::CTransaction((CTransaction *)local_778,&local_a28);
  bVar5 = IsStandardTx((CTransaction *)local_778,&local_228);
  local_8a0[0] = bVar5;
  local_8a0._8_4_ = 0;
  local_8a0[0xc] = '\0';
  local_8a0[0xd] = '\0';
  local_8a0[0xe] = '\0';
  local_8a0[0xf] = '\0';
  local_8a0[0x10] = '\0';
  local_8a0[0x11] = '\0';
  local_8a0[0x12] = '\0';
  local_8a0[0x13] = '\0';
  local_8a0._20_4_ = 0;
  uStack_3d0 = &local_990;
  local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xecc240;
  local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xecc26a;
  assertion_descr = (lazy_ostream *)local_3e8;
  local_3e8._8_4_ = local_3e8._8_4_ & 0xffffff00;
  local_3e8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_3e8[0x10] = '8';
  local_3e8[0x11] = '!';
  local_3e8[0x12] = '<';
  local_3e8[0x13] = '\x01';
  local_3e8[0x14] = '\0';
  local_3e8[0x15] = '\0';
  local_3e8[0x16] = '\0';
  local_3e8[0x17] = '\0';
  local_a58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_a50 = "";
  args_1 = (int *)0x1;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_8a0,assertion_descr,1,0,WARN,(check_type)ppuVar11,
             (size_t)&local_a58,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)(local_8a0 + 0x10));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_760);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_778);
  lVar7 = 0;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)(local_3e8 + lVar7));
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x1c0);
  lVar7 = 0;
  do {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)assertion_descr,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&assertion_descr[1].m_empty,1);
    *(int *)(assertion_descr->_vptr_lazy_ostream + 4) = (int)lVar7;
    CMutableTransaction::GetHash((Txid *)local_778,&local_a28);
    pp_Var2 = assertion_descr->_vptr_lazy_ostream;
    pp_Var2[2] = (_func_int *)local_768;
    pp_Var2[3] = (_func_int *)
                 avStack_760[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
    *pp_Var2 = (_func_int *)local_778._0_8_;
    pp_Var2[1] = (_func_int *)local_778._8_8_;
    **(undefined8 **)&assertion_descr[1].m_empty = 1;
    lVar7 = lVar7 + 1;
    assertion_descr = (lazy_ostream *)&assertion_descr[3].m_empty;
  } while (lVar7 != 8);
  local_ac8._0_4_ = 0;
  do {
    local_778._0_8_ = local_778._0_8_ & 0xffffffffffff0000;
    local_6b0._M_color = _S_red;
    local_6b0._M_parent = (_Base_ptr)0x0;
    memset(local_778 + 8,0,0xb8);
    local_6b0._M_left = &local_6b0;
    local_690 = 0;
    local_620 = false;
    local_610._M_color = _S_red;
    local_610._M_parent = (_Base_ptr)0x0;
    local_610._M_left = &local_610;
    local_5f0 = 0;
    local_5e0._M_color = _S_red;
    local_5e0._M_parent = (_Base_ptr)0x0;
    local_5e0._M_left = &local_5e0;
    local_598._M_color = _S_red;
    local_598._M_parent = (_Base_ptr)0x0;
    local_5c0 = 0;
    puStack_5b8 = (pointer)0x0;
    local_5b0 = (pointer)0x0;
    puStack_5a8 = (pointer)0x0;
    local_598._M_left = &local_598;
    local_578 = 0;
    local_568._M_color = _S_red;
    local_568._M_parent = (_Base_ptr)0x0;
    local_568._M_left = &local_568;
    local_548 = 0;
    local_538._M_color = _S_red;
    local_538._M_parent = (_Base_ptr)0x0;
    local_538._M_left = &local_538;
    local_4a0._M_color = _S_red;
    local_4a0._M_parent = (_Base_ptr)0x0;
    local_518 = 0;
    pCStack_510 = (pointer)0x0;
    local_508 = (pointer)0x0;
    pCStack_500 = (pointer)0x0;
    local_4f8 = (pointer)0x0;
    pCStack_4f0 = (pointer)0x0;
    local_4e8 = (pointer)0x0;
    auStack_4e0[0] = '\0';
    auStack_4e0[1] = '\0';
    auStack_4e0[2] = '\0';
    auStack_4e0[3] = '\0';
    auStack_4e0[4] = '\0';
    auStack_4e0[5] = '\0';
    auStack_4e0[6] = '\0';
    auStack_4e0[7] = '\0';
    auStack_4e0[8] = '\0';
    auStack_4e0[9] = '\0';
    auStack_4e0[10] = '\0';
    auStack_4e0[0xb] = '\0';
    auStack_4e0[0xc] = '\0';
    auStack_4e0[0xd] = '\0';
    auStack_4e0[0xe] = '\0';
    auStack_4e0[0xf] = '\0';
    auStack_4e0[0x10] = '\0';
    auStack_4e0[0x11] = '\0';
    auStack_4e0[0x12] = '\0';
    auStack_4e0[0x13] = '\0';
    auStack_4e0[0x14] = '\0';
    auStack_4e0[0x15] = '\0';
    auStack_4e0[0x16] = '\0';
    auStack_4e0[0x17] = '\0';
    auStack_4e0[0x18] = '\0';
    auStack_4e0[0x19] = '\0';
    auStack_4e0[0x1a] = '\0';
    auStack_4e0[0x1b] = '\0';
    auStack_4e0[0x1c] = '\0';
    auStack_4e0[0x1d] = '\0';
    auStack_4e0[0x1e] = '\0';
    auStack_4e0[0x1f] = '\0';
    auStack_4e0[0x20] = '\0';
    auStack_4e0[0x21] = '\0';
    auStack_4e0[0x22] = '\0';
    auStack_4e0[0x23] = '\0';
    auStack_4e0[0x24] = '\0';
    auStack_4e0[0x25] = '\0';
    auStack_4e0[0x26] = '\0';
    auStack_4e0[0x27] = '\0';
    auStack_4e0[0x28] = '\0';
    auStack_4e0[0x29] = '\0';
    auStack_4e0[0x2a] = '\0';
    auStack_4e0[0x2b] = '\0';
    auStack_4e0[0x2c] = '\0';
    auStack_4e0[0x2d] = '\0';
    auStack_4e0[0x2e] = '\0';
    auStack_4e0[0x2f] = '\0';
    auStack_4e0[0x30] = '\0';
    auStack_4e0[0x31] = '\0';
    auStack_4e0[0x32] = '\0';
    auStack_4e0[0x33] = '\0';
    local_4a0._M_left = &local_4a0;
    local_480 = 0;
    local_470._M_color = _S_red;
    local_470._M_parent = (_Base_ptr)0x0;
    local_470._M_left = &local_470;
    local_450 = 0;
    local_440._M_color = _S_red;
    local_440._M_parent = (_Base_ptr)0x0;
    local_440._M_left = &local_440;
    local_420 = 0;
    local_410._M_color = _S_red;
    local_410._M_parent = (_Base_ptr)0x0;
    local_410._M_left = &local_410;
    local_3f0 = 0;
    local_a68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_a60 = "";
    local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x70;
    file_02.m_begin = (iterator)&local_a68;
    msg_02.m_end = pvVar10;
    msg_02.m_begin = (iterator)args_1;
    local_6b0._M_right = local_6b0._M_left;
    local_610._M_right = local_610._M_left;
    local_5e0._M_right = local_5e0._M_left;
    local_598._M_right = local_598._M_left;
    local_568._M_right = local_568._M_left;
    local_538._M_right = local_538._M_left;
    local_4a0._M_right = local_4a0._M_left;
    local_470._M_right = local_470._M_left;
    local_440._M_right = local_440._M_left;
    local_410._M_right = local_410._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_a78,
               msg_02);
    CTransaction::CTransaction((CTransaction *)local_8a0,&local_a28);
    local_8c0[0] = SignSignature(&local_c8.super_SigningProvider,(CTransaction *)local_8a0,
                                 (CMutableTransaction *)
                                 (local_3e8 + (long)(int)local_ac8._0_4_ * 0x38),0,1,
                                 (SignatureData *)local_778);
    local_8c0._8_8_ = (element_type *)0x0;
    local_8c0._16_8_ = (sp_counted_base *)0x0;
    tinyformat::format<int>((string *)&local_910,"SignSignature %d",(int *)&local_ac8);
    local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                 _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013adf88;
    local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_a88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
    ;
    local_a80 = "";
    args_1 = (int *)0x1;
    pvVar10 = (iterator)0x1;
    local_990.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = &local_910.m_tx_out;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_8c0,(lazy_ostream *)&local_990,1,1,WARN,
               (check_type)ppuVar11,(size_t)&local_a88,0x70);
    if ((undefined1 *)local_910.m_tx_out.nValue !=
        (undefined1 *)((long)&local_910.m_tx_out.scriptPubKey.super_CScriptBase._union + 8)) {
      operator_delete((void *)local_910.m_tx_out.nValue,
                      local_910.m_tx_out.scriptPubKey.super_CScriptBase._union._8_8_ + 1);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_8c0 + 0x10));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_888);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_8a0);
    SignatureData::~SignatureData((SignatureData *)local_778);
    iVar6 = local_ac8._0_4_ + 1;
    bVar5 = (int)local_ac8._0_4_ < 7;
    local_ac8._0_4_ = iVar6;
  } while (bVar5);
  SignatureCache::SignatureCache((SignatureCache *)local_778,0x1000000);
  local_a8c = 0;
  do {
    PrecomputedTransactionData::PrecomputedTransactionData<CMutableTransaction>
              ((PrecomputedTransactionData *)local_8a0,
               (CMutableTransaction *)(local_3e8 + (long)local_a8c * 0x38));
    local_a90 = 0;
    do {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_8c0,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (*(long *)(local_3e8 + (long)local_a8c * 0x38) + 0x28));
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (*(long *)(local_3e8 + (long)local_a8c * 0x38) + 0x28),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (*(long *)(local_3e8 + (long)local_a90 * 0x38) + 0x28));
      pCVar4 = local_a28.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = (((((CMutableTransaction *)(local_3e8 + (long)local_a8c * 0x38))->vin).
                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
               _M_start)->prevout).n;
      CTransaction::CTransaction
                (&local_990,(CMutableTransaction *)(local_3e8 + (long)local_a8c * 0x38));
      local_910.m_tx_out.nValue = *(CAmount *)((long)(&pCVar4[uVar1].scriptPubKey + -1) + 0x18);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&local_910.m_tx_out.scriptPubKey.super_CScriptBase,
                 &pCVar4[uVar1].scriptPubKey.super_CScriptBase);
      local_910.nIn = 0;
      local_910.nFlags = 3;
      local_910.cacheStore = false;
      local_910.error = SCRIPT_ERR_UNKNOWN_ERROR;
      local_910.txdata = (PrecomputedTransactionData *)local_8a0;
      local_910.m_signature_cache = (SignatureCache *)local_778;
      local_910.ptxTo = &local_990;
      bVar5 = CScriptCheck::operator()(&local_910);
      if (0x1c < local_910.m_tx_out.scriptPubKey.super_CScriptBase._size) {
        free(local_910.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        local_910.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)0x0;
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_990.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_990.vin);
      if (local_a8c == local_a90) {
        local_aa0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_a98 = "";
        local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x7d;
        file_03.m_begin = (iterator)&local_aa0;
        msg_03.m_end = pvVar10;
        msg_03.m_begin = (iterator)args_1;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_ab0
                   ,msg_03);
        local_ac8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar5;
        local_ac8.m_message.px = (element_type *)0x0;
        local_ac8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        tinyformat::format<int,int>
                  ((string *)&local_910,(tinyformat *)"VerifySignature %d %d",(char *)&local_a8c,
                   &local_a90,args_1);
        local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013adf88;
        local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_ad8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_ad0 = "";
        args_1 = (int *)0x1;
        pvVar10 = (iterator)0x1;
        local_990.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = &local_910.m_tx_out;
        boost::test_tools::tt_detail::report_assertion
                  (&local_ac8,(lazy_ostream *)&local_990,1,1,WARN,(check_type)ppuVar11,
                   (size_t)&local_ad8,0x7d);
      }
      else {
        local_ae8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_ae0 = "";
        local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x7f;
        file_04.m_begin = (iterator)&local_ae8;
        msg_04.m_end = pvVar10;
        msg_04.m_begin = (iterator)args_1;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_af8
                   ,msg_04);
        local_ac8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)!bVar5;
        local_ac8.m_message.px = (element_type *)0x0;
        local_ac8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        tinyformat::format<int,int>
                  ((string *)&local_910,(tinyformat *)"VerifySignature %d %d",(char *)&local_a8c,
                   &local_a90,args_1);
        local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013adf88;
        local_990.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_b08 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
        ;
        local_b00 = "";
        args_1 = (int *)0x1;
        pvVar10 = (iterator)0x1;
        local_990.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = &local_910.m_tx_out;
        boost::test_tools::tt_detail::report_assertion
                  (&local_ac8,(lazy_ostream *)&local_990,1,1,WARN,(check_type)ppuVar11,
                   (size_t)&local_b08,0x7f);
      }
      if ((undefined1 *)local_910.m_tx_out.nValue !=
          (undefined1 *)((long)&local_910.m_tx_out.scriptPubKey.super_CScriptBase._union + 8)) {
        operator_delete((void *)local_910.m_tx_out.nValue,
                        local_910.m_tx_out.scriptPubKey.super_CScriptBase._union._8_8_ + 1);
      }
      boost::detail::shared_count::~shared_count(&local_ac8.m_message.pn);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (*(long *)(local_3e8 + (long)local_a8c * 0x38) + 0x28),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_8c0);
      if (0x1c < local_8a4) {
        free((void *)CONCAT71(local_8c0._1_7_,local_8c0[0]));
      }
      iVar6 = local_a90 + 1;
      bVar5 = local_a90 < 7;
      local_a90 = iVar6;
    } while (bVar5);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_798);
    iVar6 = local_a8c + 1;
    bVar5 = local_a8c < 7;
    local_a8c = iVar6;
  } while (bVar5);
  if (local_688._M_value.m_branch.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_688._M_value.m_branch.
                    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,local_688._40_8_ - local_688._8_8_);
    local_688._M_value.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_688._16_4_ = 0;
    local_688._M_value.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_688._32_4_ = 0;
    local_688._40_8_ = 0;
  }
  if ((void *)local_688._0_8_ != (void *)0x0) {
    operator_delete__((void *)local_688._0_8_);
  }
  local_688._0_8_ = 0;
  if (local_6b0._M_parent != (_Base_ptr)0x0) {
    operator_delete(local_6b0._M_parent,(long)local_6b0._M_right - (long)local_6b0._M_parent);
  }
  lVar7 = -0x1c0;
  this_00 = local_248;
  do {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_00);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)(this_00 + -3));
    this_00 = this_00 + -7;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_a28.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_a28.vin);
  lVar7 = 0x60;
  do {
    if (0x1c < *(uint *)((long)auStack_1ec + lVar7)) {
      free(*(void **)(local_208 + lVar7));
      *(undefined8 *)(local_208 + lVar7) = 0;
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x60;
  do {
    if (0x1c < *(uint *)((long)&uStack_16c + lVar7)) {
      free(*(void **)(local_188 + lVar7));
      *(undefined8 *)(local_188 + lVar7) = 0;
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  lVar7 = 0x38;
  do {
    if (*(array<unsigned_char,_32UL> **)(&local_108[0].fCompressed + lVar7) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&local_108[0].fCompressed + lVar7),
                 *(array<unsigned_char,_32UL> **)(&local_108[0].fCompressed + lVar7));
    }
    *(undefined8 *)(&local_108[0].fCompressed + lVar7) = 0;
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -8);
  local_c8.super_SigningProvider._vptr_SigningProvider = (_func_int **)ppuVar11;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_c8.mapScripts._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_c8.mapKeys._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign)
{
    // Pay-to-script-hash looks like this:
    // scriptSig:    <sig> <sig...> <serialized_script>
    // scriptPubKey: HASH160 <hash> EQUAL

    // Test SignSignature() (and therefore the version of Solver() that signs transactions)
    FillableSigningProvider keystore;
    CKey key[4];
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }

    // 8 Scripts: checking all combinations of
    // different keys, straight/P2SH, pubkey/pubkeyhash
    CScript standardScripts[4];
    standardScripts[0] << ToByteVector(key[0].GetPubKey()) << OP_CHECKSIG;
    standardScripts[1] = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    standardScripts[2] << ToByteVector(key[1].GetPubKey()) << OP_CHECKSIG;
    standardScripts[3] = GetScriptForDestination(PKHash(key[2].GetPubKey()));
    CScript evalScripts[4];
    for (int i = 0; i < 4; i++)
    {
        BOOST_CHECK(keystore.AddCScript(standardScripts[i]));
        evalScripts[i] = GetScriptForDestination(ScriptHash(standardScripts[i]));
    }

    CMutableTransaction txFrom;  // Funding transaction:
    std::string reason;
    txFrom.vout.resize(8);
    for (int i = 0; i < 4; i++)
    {
        txFrom.vout[i].scriptPubKey = evalScripts[i];
        txFrom.vout[i].nValue = COIN;
        txFrom.vout[i+4].scriptPubKey = standardScripts[i];
        txFrom.vout[i+4].nValue = COIN;
    }
    BOOST_CHECK(IsStandardTx(CTransaction(txFrom), reason));

    CMutableTransaction txTo[8]; // Spending transactions
    for (int i = 0; i < 8; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }
    for (int i = 0; i < 8; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
    }
    // All of the above should be OK, and the txTos have valid signatures
    // Check to make sure signature verification fails if we use the wrong ScriptSig:
    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};
    for (int i = 0; i < 8; i++) {
        PrecomputedTransactionData txdata(txTo[i]);
        for (int j = 0; j < 8; j++)
        {
            CScript sigSave = txTo[i].vin[0].scriptSig;
            txTo[i].vin[0].scriptSig = txTo[j].vin[0].scriptSig;
            bool sigOK = CScriptCheck(txFrom.vout[txTo[i].vin[0].prevout.n], CTransaction(txTo[i]), signature_cache, 0, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_STRICTENC, false, &txdata)();
            if (i == j)
                BOOST_CHECK_MESSAGE(sigOK, strprintf("VerifySignature %d %d", i, j));
            else
                BOOST_CHECK_MESSAGE(!sigOK, strprintf("VerifySignature %d %d", i, j));
            txTo[i].vin[0].scriptSig = sigSave;
        }
    }
}